

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.cc
# Opt level: O0

uint AddBodyFixedJoint(Model *model,uint parent_id,SpatialTransform *joint_frame,Joint *joint,
                      Body *body,string *body_name)

{
  bool bVar1;
  uint uVar2;
  mapped_type mVar3;
  size_type sVar4;
  ostream *poVar5;
  long lVar6;
  mapped_type *pmVar7;
  uint in_ESI;
  long in_RDI;
  string *in_R9;
  Body parent_body;
  FixedBody fixed_parent;
  FixedBody fbody;
  Body *in_stack_000006e0;
  SpatialTransform *in_stack_000006e8;
  Body *in_stack_000006f0;
  undefined4 in_stack_fffffffffffffbc8;
  undefined4 in_stack_fffffffffffffbcc;
  FixedBody *in_stack_fffffffffffffbd0;
  value_type *in_stack_fffffffffffffbd8;
  vector<RigidBodyDynamics::FixedBody,_Eigen::aligned_allocator<RigidBodyDynamics::FixedBody>_>
  *in_stack_fffffffffffffbe0;
  Model *in_stack_fffffffffffffbe8;
  key_type *in_stack_fffffffffffffc08;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  *in_stack_fffffffffffffc10;
  _Self local_3d0;
  _Self local_3c8 [11];
  SpatialTransform *in_stack_fffffffffffffc90;
  SpatialTransform *in_stack_fffffffffffffc98;
  Body local_360;
  Matrix3d *in_stack_fffffffffffffd48;
  Vector3d *in_stack_fffffffffffffd50;
  double in_stack_fffffffffffffd58;
  uint local_228;
  uint local_f8;
  
  RigidBodyDynamics::FixedBody::CreateFromBody((Body *)in_stack_fffffffffffffbd8);
  RigidBodyDynamics::Math::SpatialTransform::operator=
            ((SpatialTransform *)in_stack_fffffffffffffbd0,
             (SpatialTransform *)CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8));
  bVar1 = RigidBodyDynamics::Model::IsFixedBodyId
                    (in_stack_fffffffffffffbe8,(uint)((ulong)in_stack_fffffffffffffbe0 >> 0x20));
  local_f8 = in_ESI;
  if (bVar1) {
    std::
    vector<RigidBodyDynamics::FixedBody,_Eigen::aligned_allocator<RigidBodyDynamics::FixedBody>_>::
    operator[]((vector<RigidBodyDynamics::FixedBody,_Eigen::aligned_allocator<RigidBodyDynamics::FixedBody>_>
                *)(in_RDI + 0x2e8),(ulong)(in_ESI - *(int *)(in_RDI + 0x300)));
    RigidBodyDynamics::FixedBody::FixedBody
              (in_stack_fffffffffffffbd0,
               (FixedBody *)CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8));
    local_f8 = local_228;
    RigidBodyDynamics::Math::SpatialTransform::operator*
              (in_stack_fffffffffffffc98,in_stack_fffffffffffffc90);
    RigidBodyDynamics::Math::SpatialTransform::operator=
              ((SpatialTransform *)in_stack_fffffffffffffbd0,
               (SpatialTransform *)CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8));
  }
  std::vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>::
  operator[]((vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_> *)
             (in_RDI + 0x308),(ulong)local_f8);
  RigidBodyDynamics::Body::Body
            ((Body *)in_stack_fffffffffffffbd0,
             (Body *)CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8));
  RigidBodyDynamics::Body::Join(in_stack_000006f0,in_stack_000006e8,in_stack_000006e0);
  std::vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>::
  operator[]((vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_> *)
             (in_RDI + 0x308),(ulong)local_f8);
  RigidBodyDynamics::Body::operator=
            ((Body *)in_stack_fffffffffffffbd0,
             (Body *)CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8));
  RigidBodyDynamics::Math::SpatialRigidBodyInertia::createFromMassComInertiaC
            (in_stack_fffffffffffffd58,in_stack_fffffffffffffd50,in_stack_fffffffffffffd48);
  std::
  vector<RigidBodyDynamics::Math::SpatialRigidBodyInertia,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialRigidBodyInertia>_>
  ::operator[]((vector<RigidBodyDynamics::Math::SpatialRigidBodyInertia,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialRigidBodyInertia>_>
                *)(in_RDI + 0x270),(ulong)local_f8);
  RigidBodyDynamics::Math::SpatialRigidBodyInertia::operator=
            ((SpatialRigidBodyInertia *)in_stack_fffffffffffffbd0,
             (SpatialRigidBodyInertia *)
             CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8));
  std::vector<RigidBodyDynamics::FixedBody,_Eigen::aligned_allocator<RigidBodyDynamics::FixedBody>_>
  ::push_back(in_stack_fffffffffffffbe0,in_stack_fffffffffffffbd8);
  sVar4 = std::
          vector<RigidBodyDynamics::FixedBody,_Eigen::aligned_allocator<RigidBodyDynamics::FixedBody>_>
          ::size((vector<RigidBodyDynamics::FixedBody,_Eigen::aligned_allocator<RigidBodyDynamics::FixedBody>_>
                  *)(in_RDI + 0x2e8));
  uVar2 = std::numeric_limits<unsigned_int>::max();
  if (sVar4 <= uVar2 - *(int *)(in_RDI + 0x300)) {
    lVar6 = std::__cxx11::string::size();
    if (lVar6 != 0) {
      local_3c8[0]._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                   *)CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8),
                  (key_type *)0x23a2c7);
      local_3d0._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                  *)CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8));
      bVar1 = std::operator!=(local_3c8,&local_3d0);
      if (bVar1) {
        poVar5 = std::operator<<((ostream *)&std::cerr,"Error: Body with name \'");
        poVar5 = std::operator<<(poVar5,in_R9);
        poVar5 = std::operator<<(poVar5,"\' already exists!");
        std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
        abort();
      }
      sVar4 = std::
              vector<RigidBodyDynamics::FixedBody,_Eigen::aligned_allocator<RigidBodyDynamics::FixedBody>_>
              ::size((vector<RigidBodyDynamics::FixedBody,_Eigen::aligned_allocator<RigidBodyDynamics::FixedBody>_>
                      *)(in_RDI + 0x2e8));
      mVar3 = (int)sVar4 + -1 + *(int *)(in_RDI + 0x300);
      pmVar7 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
               ::operator[](in_stack_fffffffffffffc10,in_stack_fffffffffffffc08);
      *pmVar7 = mVar3;
    }
    sVar4 = std::
            vector<RigidBodyDynamics::FixedBody,_Eigen::aligned_allocator<RigidBodyDynamics::FixedBody>_>
            ::size((vector<RigidBodyDynamics::FixedBody,_Eigen::aligned_allocator<RigidBodyDynamics::FixedBody>_>
                    *)(in_RDI + 0x2e8));
    uVar2 = ((int)sVar4 + *(int *)(in_RDI + 0x300)) - 1;
    RigidBodyDynamics::Body::~Body(&local_360);
    return uVar2;
  }
  poVar5 = std::operator<<((ostream *)&std::cerr,"Error: cannot add more than ");
  uVar2 = std::numeric_limits<unsigned_int>::max();
  sVar4 = std::
          vector<RigidBodyDynamics::FixedBody,_Eigen::aligned_allocator<RigidBodyDynamics::FixedBody>_>
          ::size((vector<RigidBodyDynamics::FixedBody,_Eigen::aligned_allocator<RigidBodyDynamics::FixedBody>_>
                  *)(in_RDI + 0x2e8));
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,uVar2 - sVar4);
  poVar5 = std::operator<<(poVar5,
                           " fixed bodies. You need to modify Model::fixed_body_discriminator for this."
                          );
  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  abort();
}

Assistant:

unsigned int AddBodyFixedJoint (
		Model &model,
		const unsigned int parent_id,
		const SpatialTransform &joint_frame,
		const Joint &joint,
		const Body &body,
		std::string body_name) {
	FixedBody fbody = FixedBody::CreateFromBody (body);
	fbody.mMovableParent = parent_id;
	fbody.mParentTransform = joint_frame;

	if (model.IsFixedBodyId(parent_id)) {
		FixedBody fixed_parent = model.mFixedBodies[parent_id - model.fixed_body_discriminator];

		fbody.mMovableParent = fixed_parent.mMovableParent;
		fbody.mParentTransform = joint_frame * fixed_parent.mParentTransform;
	}

	// merge the two bodies
	Body parent_body = model.mBodies[fbody.mMovableParent];
	parent_body.Join (fbody.mParentTransform, body);
	model.mBodies[fbody.mMovableParent] = parent_body;
	model.I[fbody.mMovableParent] = SpatialRigidBodyInertia::createFromMassComInertiaC (parent_body.mMass, parent_body.mCenterOfMass, parent_body.mInertia);

	model.mFixedBodies.push_back (fbody);

	if (model.mFixedBodies.size() > std::numeric_limits<unsigned int>::max() - model.fixed_body_discriminator) {
		std::cerr << "Error: cannot add more than " << std::numeric_limits<unsigned int>::max() - model.mFixedBodies.size() << " fixed bodies. You need to modify Model::fixed_body_discriminator for this." << std::endl;
		assert (0);
		abort();
	}

	if (body_name.size() != 0) {
		if (model.mBodyNameMap.find(body_name) != model.mBodyNameMap.end()) {
			std::cerr << "Error: Body with name '" << body_name << "' already exists!" << std::endl;
			assert (0);
			abort();
		}
		model.mBodyNameMap[body_name] = model.mFixedBodies.size() + model.fixed_body_discriminator - 1;
	}

	return model.mFixedBodies.size() + model.fixed_body_discriminator - 1;
}